

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O2

int mbedtls_x509_string_to_names(mbedtls_asn1_named_data **head,char *name)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_asn1_named_data *pmVar4;
  uchar *__s2;
  long lVar5;
  uchar uVar6;
  char *__s;
  uchar *puVar7;
  x509_attr_descriptor_t *pxVar8;
  uchar *puVar9;
  char data [256];
  uchar local_138 [264];
  
  sVar3 = strlen(name);
  puVar7 = (uchar *)(name + sVar3);
  mbedtls_asn1_free_named_data_list(head);
  __s = (char *)0x0;
  __s2 = (uchar *)name;
  puVar9 = local_138;
LAB_0010be6f:
  bVar1 = false;
LAB_0010be71:
  if (puVar7 < name) {
    return 0;
  }
  uVar6 = *name;
  if (!bVar1) {
    if (uVar6 != '=') goto LAB_0010bf8f;
    for (pxVar8 = x509_attrs; pxVar8->name != (char *)0x0; pxVar8 = pxVar8 + 1) {
      if ((pxVar8->name_len == (long)name - (long)__s2) &&
         (iVar2 = strncmp(pxVar8->name,(char *)__s2,(long)name - (long)__s2), iVar2 == 0))
      goto LAB_0010bec2;
    }
    pxVar8 = x509_attrs + 0x1c;
LAB_0010bec2:
    __s = pxVar8->oid;
    if (__s == (char *)0x0) {
      return -0x2100;
    }
    __s2 = (uchar *)name + 1;
    puVar9 = local_138;
  }
  if ((uchar *)name == puVar7 || uVar6 != '\\') {
    if (uVar6 == ',' || (uchar *)name == puVar7) goto LAB_0010bf4a;
  }
  else {
    name = (char *)((uchar *)name + 1);
    if ((uchar *)name == puVar7) {
      return -0x2380;
    }
    uVar6 = ',';
    if (*name != ',') {
      return -0x2380;
    }
  }
  name = (char *)((uchar *)name + 1);
  bVar1 = true;
  if (__s2 != (uchar *)name) {
    *puVar9 = uVar6;
    lVar5 = (long)puVar9 - (long)local_138;
    puVar9 = puVar9 + 1;
    if (lVar5 == 0xff) {
      return -0x2380;
    }
  }
  goto LAB_0010be71;
LAB_0010bf4a:
  sVar3 = strlen(__s);
  pmVar4 = mbedtls_asn1_store_named_data(head,__s,sVar3,local_138,(long)puVar9 - (long)local_138);
  __s2 = (uchar *)name;
  if (pmVar4 == (mbedtls_asn1_named_data *)0x0) {
    return -0x2880;
  }
  do {
    name = (char *)__s2;
    __s2 = (uchar *)name + 1;
    if (puVar7 <= name) break;
  } while (*__s2 == ' ');
LAB_0010bf8f:
  name = (char *)((uchar *)name + 1);
  goto LAB_0010be6f;
}

Assistant:

int mbedtls_x509_string_to_names( mbedtls_asn1_named_data **head, const char *name )
{
    int ret = 0;
    const char *s = name, *c = s;
    const char *end = s + strlen( s );
    const char *oid = NULL;
    int in_tag = 1;
    char data[MBEDTLS_X509_MAX_DN_NAME_SIZE];
    char *d = data;

    /* Clear existing chain if present */
    mbedtls_asn1_free_named_data_list( head );

    while( c <= end )
    {
        if( in_tag && *c == '=' )
        {
            if( ( oid = x509_at_oid_from_name( s, c - s ) ) == NULL )
            {
                ret = MBEDTLS_ERR_X509_UNKNOWN_OID;
                goto exit;
            }

            s = c + 1;
            in_tag = 0;
            d = data;
        }

        if( !in_tag && *c == '\\' && c != end )
        {
            c++;

            /* Check for valid escaped characters */
            if( c == end || *c != ',' )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }
        else if( !in_tag && ( *c == ',' || c == end ) )
        {
            if( mbedtls_asn1_store_named_data( head, oid, strlen( oid ),
                                       (unsigned char *) data,
                                       d - data ) == NULL )
            {
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );
            }

            while( c < end && *(c + 1) == ' ' )
                c++;

            s = c + 1;
            in_tag = 1;
        }

        if( !in_tag && s != c + 1 )
        {
            *(d++) = *c;

            if( d - data == MBEDTLS_X509_MAX_DN_NAME_SIZE )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }

        c++;
    }

exit:

    return( ret );
}